

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_add_image(nk_draw_list *list,nk_image texture,nk_rect rect,nk_color color)

{
  nk_vec2 uvc;
  nk_vec2 uvc_00;
  nk_bool nVar1;
  float in_ESI;
  long in_RDI;
  nk_vec2 in_XMM0_Qa;
  nk_vec2 in_XMM1_Qa;
  nk_vec2 unaff_retaddr;
  nk_vec2 uv [2];
  nk_draw_list *in_stack_ffffffffffffff78;
  nk_handle in_stack_ffffffffffffff80;
  nk_draw_list *in_stack_ffffffffffffffd8;
  nk_color color_00;
  float in_stack_ffffffffffffffe8;
  
  if (in_RDI != 0) {
    nk_draw_list_push_image(in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
    color_00 = SUB84((ulong)in_RDI >> 0x20,0);
    nVar1 = nk_image_is_subimage((nk_image *)&stack0x00000008);
    if (nVar1 == 0) {
      nk_vec2(in_XMM0_Qa.x,in_XMM0_Qa.y);
      nk_vec2(in_XMM0_Qa.x + in_XMM1_Qa.x,in_XMM0_Qa.y + in_XMM1_Qa.y);
      nk_vec2(0.0,0.0);
      nk_vec2(1.0,1.0);
      uvc_00.y = in_ESI;
      uvc_00.x = in_stack_ffffffffffffffe8;
      nk_draw_list_push_rect_uv
                (in_stack_ffffffffffffffd8,unaff_retaddr,in_XMM1_Qa,in_XMM0_Qa,uvc_00,color_00);
    }
    else {
      nk_vec2(in_XMM0_Qa.x,in_XMM0_Qa.y);
      nk_vec2(in_XMM0_Qa.x + in_XMM1_Qa.x,in_XMM0_Qa.y + in_XMM1_Qa.y);
      uvc.y = in_ESI;
      uvc.x = in_stack_ffffffffffffffe8;
      nk_draw_list_push_rect_uv
                (in_stack_ffffffffffffffd8,unaff_retaddr,in_XMM1_Qa,in_XMM0_Qa,uvc,color_00);
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_add_image(struct nk_draw_list *list, struct nk_image texture,
struct nk_rect rect, struct nk_color color)
{
NK_ASSERT(list);
if (!list) return;
/* push new command with given texture */
nk_draw_list_push_image(list, texture.handle);
if (nk_image_is_subimage(&texture)) {
/* add region inside of the texture  */
struct nk_vec2 uv[2];
uv[0].x = (float)texture.region[0]/(float)texture.w;
uv[0].y = (float)texture.region[1]/(float)texture.h;
uv[1].x = (float)(texture.region[0] + texture.region[2])/(float)texture.w;
uv[1].y = (float)(texture.region[1] + texture.region[3])/(float)texture.h;
nk_draw_list_push_rect_uv(list, nk_vec2(rect.x, rect.y),
nk_vec2(rect.x + rect.w, rect.y + rect.h),  uv[0], uv[1], color);
} else nk_draw_list_push_rect_uv(list, nk_vec2(rect.x, rect.y),
nk_vec2(rect.x + rect.w, rect.y + rect.h),
nk_vec2(0.0f, 0.0f), nk_vec2(1.0f, 1.0f),color);
}